

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# caption.c
# Opt level: O2

int caption_frame_write_char
              (caption_frame_t *frame,int row,int col,eia608_style_t style,int underline,char *c)

{
  caption_frame_cell_t *pcVar1;
  uint16_t uVar2;
  size_t sVar3;
  int iVar4;
  int iVar5;
  
  iVar4 = 0;
  iVar5 = 0;
  if (frame->write != (caption_frame_buffer_t *)0x0) {
    uVar2 = _eia608_from_utf8(c);
    if ((((uVar2 != 0) && (iVar5 = iVar4, (uint)col < 0x20)) && ((uint)row < 0xf)) &&
       (frame->write != (caption_frame_buffer_t *)0x0)) {
      pcVar1 = frame->write->cell[(uint)row] + (uint)col;
      sVar3 = utf8_char_copy(pcVar1->data,c);
      if (sVar3 != 0) {
        *(byte *)pcVar1 = (char)style * '\x02' & 0xeU | (byte)underline & 1 | *(byte *)pcVar1 & 0xf0
        ;
        iVar5 = 1;
      }
    }
  }
  return iVar5;
}

Assistant:

int caption_frame_write_char(caption_frame_t* frame, int row, int col, eia608_style_t style, int underline, const char* c)
{
    if (!frame->write || !_eia608_from_utf8(c)) {
        return 0;
    }

    caption_frame_cell_t* cell = frame_buffer_cell(frame->write, row, col);

    if (cell && utf8_char_copy(&cell->data[0], c)) {
        cell->uln = underline;
        cell->sty = style;
        return 1;
    }

    return 0;
}